

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnBackward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *U,
          DecomposeType dec)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  complex<float> *pcVar6;
  complex<float> *pcVar7;
  long lVar8;
  long lVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float local_48;
  float fStack_44;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    uVar5 = (ulong)(uint)this->fNumEq;
    while (1 < (int)uVar5) {
      uVar1 = uVar5 - 2;
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar3[uVar5 - 2];
      iVar2 = piVar3[uVar5 - 1];
      local_48 = 0.0;
      fStack_44 = 0.0;
      lVar8 = lVar9;
      lVar4 = lVar9 * 8;
      while( true ) {
        lVar8 = lVar8 + 1;
        piVar3 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar2 <= lVar8) break;
        pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(U,(long)piVar3[lVar8],0);
        std::operator*(pcVar6,(complex<float> *)
                              ((long)&(this->fEqValues).
                                      super_TPZManVector<std::complex<float>,_1000>.
                                      super_TPZVec<std::complex<float>_>.fStore[1]._M_value + lVar4)
                      );
        local_48 = local_48 - extraout_XMM0_Da_00;
        fStack_44 = fStack_44 - extraout_XMM0_Db_00;
        lVar4 = lVar4 + 8;
      }
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(U,(long)piVar3[lVar9],0);
      pcVar6->_M_value =
           CONCAT44(fStack_44 + (float)(pcVar6->_M_value >> 0x20),local_48 + (float)pcVar6->_M_value
                   );
      uVar5 = uVar1;
      if ((dec & ~ELUPivot) == ELU) {
        pcVar6 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<float>::operator/=(pcVar7,pcVar6 + lVar9);
      }
    }
  }
  else if (this->fSymmetric == EIsSymmetric) {
    uVar5 = (ulong)(uint)this->fNumEq;
    while (0 < (int)uVar5) {
      uVar1 = uVar5 - 1;
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar3[uVar5 - 1];
      iVar2 = piVar3[uVar5];
      local_48 = 0.0;
      fStack_44 = 0.0;
      lVar8 = lVar9;
      lVar4 = lVar9 * 8;
      while( true ) {
        lVar8 = lVar8 + 1;
        piVar3 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar2 <= lVar8) break;
        pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(U,(long)piVar3[lVar8],0);
        std::operator*(pcVar6,(complex<float> *)
                              ((long)&(this->fEqValues).
                                      super_TPZManVector<std::complex<float>,_1000>.
                                      super_TPZVec<std::complex<float>_>.fStore[1]._M_value + lVar4)
                      );
        local_48 = local_48 - extraout_XMM0_Da;
        fStack_44 = fStack_44 - extraout_XMM0_Db;
        lVar4 = lVar4 + 8;
      }
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(U,(long)piVar3[lVar9],0);
      pcVar6->_M_value =
           CONCAT44(fStack_44 + (float)(pcVar6->_M_value >> 0x20),local_48 + (float)pcVar6->_M_value
                   );
      uVar5 = uVar1;
      if (dec == ECholesky) {
        pcVar6 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<float>::operator/=(pcVar7,pcVar6 + lVar9);
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}